

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<(anonymous_namespace)::MyItem>::resize
          (ImVector<(anonymous_namespace)::MyItem> *this,int new_size,MyItem *v)

{
  undefined8 *puVar1;
  char *pcVar2;
  MyItem *pMVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = this->Capacity;
  if (iVar6 < new_size) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= new_size) {
      iVar6 = new_size;
    }
    pMVar3 = (MyItem *)ImGui::MemAlloc((long)iVar6 * 0x18);
    if (this->Data != (MyItem *)0x0) {
      memcpy(pMVar3,this->Data,(long)this->Size * 0x18);
      ImGui::MemFree(this->Data);
    }
    this->Data = pMVar3;
    this->Capacity = iVar6;
  }
  lVar4 = (long)this->Size;
  if (this->Size < new_size) {
    lVar5 = lVar4 * 0x18;
    for (; lVar4 < new_size; lVar4 = lVar4 + 1) {
      pMVar3 = this->Data;
      *(undefined8 *)((long)&pMVar3->Quantity + lVar5) = *(undefined8 *)&v->Quantity;
      pcVar2 = v->Name;
      puVar1 = (undefined8 *)((long)&pMVar3->ID + lVar5);
      *puVar1 = *(undefined8 *)v;
      puVar1[1] = pcVar2;
      lVar5 = lVar5 + 0x18;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }